

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O3

ssl_open_record_t
bssl::tls_open_record
          (SSL *ssl,uint8_t *out_type,Span<unsigned_char> *out,size_t *out_consumed,
          uint8_t *out_alert,Span<unsigned_char> in)

{
  Span<const_unsigned_char> header;
  Span<unsigned_char> in_00;
  ushort uVar1;
  uchar *puVar2;
  bool bVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  int iVar6;
  ssl_open_record_t sVar7;
  SSL3_STATE *pSVar8;
  byte bVar9;
  ulong uVar10;
  size_t consumed;
  int iVar12;
  size_t in_R9;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  uint8_t type;
  uint16_t ciphertext_len;
  uint16_t version;
  CBS cbs;
  CBS body;
  uchar local_8d;
  ushort local_8c;
  ushort local_8a;
  uchar *local_88;
  CBS local_80;
  uchar *local_70;
  uchar *local_68;
  CBS local_60;
  uchar *local_50;
  uchar *puStack_48;
  uchar *local_40;
  size_t sStack_38;
  ulong uVar11;
  
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }
  bVar3 = tls_can_accept_handshake_data(ssl,out_alert);
  if (!bVar3) {
    return ssl_open_record_error;
  }
  local_68 = in.data_;
  local_80.data = in.data_;
  local_80.len = in.size_;
  iVar6 = CBS_get_u8(&local_80,&local_8d);
  if (((iVar6 == 0) || (iVar6 = CBS_get_u16(&local_80,&local_8a), iVar6 == 0)) ||
     (iVar6 = CBS_get_u16(&local_80,&local_8c), uVar1 = local_8a, iVar6 == 0)) {
    *out_consumed = 5;
    return ssl_open_record_partial;
  }
  local_88 = out_type;
  if (((ssl->s3->aead_read_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0) {
    if ((local_8a & 0xff00) != 0x300) goto LAB_0016d5a2;
  }
  else {
    if (ssl->s3->version == 0) {
      uVar5 = 0x301;
    }
    else {
      uVar4 = ssl_protocol_version(ssl);
      uVar5 = 0x303;
      if (uVar4 < 0x304) {
        uVar5 = ssl->s3->version;
      }
    }
    if (uVar1 != uVar5) {
LAB_0016d5a2:
      ERR_put_error(0x10,0,0xf7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x7f);
      *out_alert = 'F';
      return ssl_open_record_error;
    }
  }
  if (0x4140 < (ulong)local_8c) {
    iVar6 = 0x92;
    iVar12 = 0x86;
    goto LAB_0016d5f6;
  }
  iVar6 = CBS_get_bytes(&local_80,&local_60,(ulong)local_8c);
  puVar2 = local_68;
  if (iVar6 == 0) {
    *out_consumed = (ulong)local_8c + 5;
    return ssl_open_record_partial;
  }
  local_70 = (uchar *)0x5;
  if (in.size_ < 5) {
    local_70 = (uchar *)in.size_;
  }
  in_01.size_ = in_R9;
  in_01.data_ = local_70;
  ssl_do_msg_callback((bssl *)ssl,(SSL *)0x0,0x100,(int)local_68,in_01);
  *out_consumed = in.size_ - local_80.len;
  bVar3 = ssl_has_final_version(ssl);
  if ((((bVar3) && (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) &&
      ((iVar6 = SSL_in_init(ssl), iVar6 != 0 && ((local_8d == '\x14' && (local_60.len == 1)))))) &&
     (*local_60.data == '\x01')) {
    bVar9 = ssl->s3->empty_record_count + 1;
    ssl->s3->empty_record_count = bVar9;
    if (bVar9 < 0x21) {
      return ssl_open_record_discard;
    }
    iVar6 = 0xdb;
    iVar12 = 0x9f;
    goto LAB_0016d948;
  }
  pSVar8 = ssl->s3;
  if ((((pSVar8->field_0xdc & 1) != 0) &&
      (((pSVar8->aead_read_ctx)._M_t.
        super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
       (SSL_CIPHER *)0x0)) && (local_8d == '\x17')) {
    consumed = *out_consumed;
LAB_0016d859:
    sVar7 = skip_early_data((SSL *)pSVar8,out_alert,consumed);
    return sVar7;
  }
  if (pSVar8->read_sequence == 0xffffffffffffffff) {
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                  ,0xb0);
    *out_alert = 'P';
    return ssl_open_record_error;
  }
  local_50 = puVar2;
  puStack_48 = local_70;
  local_40 = local_60.data;
  sStack_38 = local_60.len;
  header.size_ = (size_t)local_70;
  header.data_ = puVar2;
  in_00.size_ = local_60.len;
  in_00.data_ = local_60.data;
  bVar3 = SSLAEADContext::Open
                    ((pSVar8->aead_read_ctx)._M_t.
                     super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl,out,local_8d,
                     local_8a,pSVar8->read_sequence,header,in_00);
  pSVar8 = ssl->s3;
  if (!bVar3) {
    if (((*(ushort *)&pSVar8->field_0xdc & 1) == 0) ||
       (((pSVar8->aead_read_ctx)._M_t.
         super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
        (SSL_CIPHER *)0x0)) {
      ERR_put_error(0x10,0,0x8b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0xbe);
      *out_alert = '\x14';
      return ssl_open_record_error;
    }
    ERR_clear_error();
    consumed = *out_consumed;
    pSVar8 = ssl->s3;
    goto LAB_0016d859;
  }
  *(ushort *)&pSVar8->field_0xdc = *(ushort *)&pSVar8->field_0xdc & 0xfffe;
  pSVar8 = ssl->s3;
  pSVar8->read_sequence = pSVar8->read_sequence + 1;
  if (((pSVar8->aead_read_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0) {
    uVar10 = out->size_;
    if (0x4000 < out->size_) goto LAB_0016d89f;
  }
  else {
    uVar5 = ssl_protocol_version(ssl);
    uVar11 = out->size_;
    if (0x4001 - (ulong)(uVar5 < 0x304) < uVar11) {
LAB_0016d89f:
      iVar6 = 0x88;
      iVar12 = 0xcf;
LAB_0016d5f6:
      ERR_put_error(0x10,0,iVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,iVar12);
      *out_alert = '\x16';
      return ssl_open_record_error;
    }
    uVar10 = uVar11;
    if (0x303 < uVar5) {
      if (local_8d != '\x17') {
        ERR_put_error(0x10,0,0xfb,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                      ,0xd7);
        *out_alert = '2';
        return ssl_open_record_error;
      }
      do {
        uVar10 = uVar11 - 1;
        if (uVar11 == 0) {
          ERR_put_error(0x10,0,0x8b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                        ,0xde);
          *out_alert = '3';
          return ssl_open_record_error;
        }
        local_8d = out->data_[uVar11 - 1];
        out->size_ = uVar10;
        uVar11 = uVar10;
      } while (local_8d == '\0');
    }
  }
  puVar2 = local_88;
  pSVar8 = ssl->s3;
  if (uVar10 == 0) {
    bVar9 = pSVar8->empty_record_count + 1;
    pSVar8->empty_record_count = bVar9;
    if (0x20 < bVar9) {
      iVar6 = 0xdb;
      iVar12 = 0xeb;
      goto LAB_0016d948;
    }
  }
  else {
    pSVar8->empty_record_count = '\0';
  }
  if (local_8d != '\x16') {
    if (local_8d == '\x15') {
      in_02.size_ = uVar10;
      in_02.data_ = out->data_;
      sVar7 = ssl_process_alert(ssl,out_alert,in_02);
      return sVar7;
    }
    bVar3 = tls_has_unprocessed_handshake_data(ssl);
    if (bVar3) {
      iVar6 = 0xe1;
      iVar12 = 0xfc;
LAB_0016d948:
      ERR_put_error(0x10,0,iVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,iVar12);
      *out_alert = '\n';
      return ssl_open_record_error;
    }
    pSVar8 = ssl->s3;
  }
  pSVar8->warning_alert_count = '\0';
  *puVar2 = local_8d;
  return ssl_open_record_success;
}

Assistant:

ssl_open_record_t tls_open_record(SSL *ssl, uint8_t *out_type,
                                  Span<uint8_t> *out, size_t *out_consumed,
                                  uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  // If there is an unprocessed handshake message or we are already buffering
  // too much, stop before decrypting another handshake record.
  if (!tls_can_accept_handshake_data(ssl, out_alert)) {
    return ssl_open_record_error;
  }

  CBS cbs = CBS(in);

  // Decode the record header.
  uint8_t type;
  uint16_t version, ciphertext_len;
  if (!CBS_get_u8(&cbs, &type) ||      //
      !CBS_get_u16(&cbs, &version) ||  //
      !CBS_get_u16(&cbs, &ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH;
    return ssl_open_record_partial;
  }

  bool version_ok;
  if (ssl->s3->aead_read_ctx->is_null_cipher()) {
    // Only check the first byte. Enforcing beyond that can prevent decoding
    // version negotiation failure alerts.
    version_ok = (version >> 8) == SSL3_VERSION_MAJOR;
  } else {
    version_ok = version == tls_record_version(ssl);
  }

  if (!version_ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_VERSION_NUMBER);
    *out_alert = SSL_AD_PROTOCOL_VERSION;
    return ssl_open_record_error;
  }

  // Check the ciphertext length.
  if (ciphertext_len > SSL3_RT_MAX_ENCRYPTED_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_ENCRYPTED_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  // Extract the body.
  CBS body;
  if (!CBS_get_bytes(&cbs, &body, ciphertext_len)) {
    *out_consumed = SSL3_RT_HEADER_LENGTH + (size_t)ciphertext_len;
    return ssl_open_record_partial;
  }

  Span<const uint8_t> header = in.subspan(0, SSL3_RT_HEADER_LENGTH);
  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, header);

  *out_consumed = in.size() - CBS_len(&cbs);

  // In TLS 1.3, during the handshake, skip ChangeCipherSpec records.
  static const uint8_t kChangeCipherSpec[] = {SSL3_MT_CCS};
  if (ssl_has_final_version(ssl) &&
      ssl_protocol_version(ssl) >= TLS1_3_VERSION && SSL_in_init(ssl) &&
      type == SSL3_RT_CHANGE_CIPHER_SPEC &&
      Span<const uint8_t>(body) == kChangeCipherSpec) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    return ssl_open_record_discard;
  }

  // Skip early data received when expecting a second ClientHello if we rejected
  // 0RTT.
  if (ssl->s3->skip_early_data &&                  //
      ssl->s3->aead_read_ctx->is_null_cipher() &&  //
      type == SSL3_RT_APPLICATION_DATA) {
    return skip_early_data(ssl, out_alert, *out_consumed);
  }

  // Ensure the sequence number update does not overflow.
  if (ssl->s3->read_sequence + 1 == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return ssl_open_record_error;
  }

  // Decrypt the body in-place.
  if (!ssl->s3->aead_read_ctx->Open(
          out, type, version, ssl->s3->read_sequence, header,
          Span(const_cast<uint8_t *>(CBS_data(&body)), CBS_len(&body)))) {
    if (ssl->s3->skip_early_data && !ssl->s3->aead_read_ctx->is_null_cipher()) {
      ERR_clear_error();
      return skip_early_data(ssl, out_alert, *out_consumed);
    }

    OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
    *out_alert = SSL_AD_BAD_RECORD_MAC;
    return ssl_open_record_error;
  }

  ssl->s3->skip_early_data = false;
  ssl->s3->read_sequence++;

  // TLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !ssl->s3->aead_read_ctx->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;

  // If there is padding, the plaintext limit includes the padding, but includes
  // extra room for the inner content type.
  size_t plaintext_limit =
      has_padding ? SSL3_RT_MAX_PLAIN_LENGTH + 1 : SSL3_RT_MAX_PLAIN_LENGTH;
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    // The outer record type is always application_data.
    if (type != SSL3_RT_APPLICATION_DATA) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_RECORD_TYPE);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (type == 0);
  }

  // Limit the number of consecutive empty records.
  if (out->empty()) {
    ssl->s3->empty_record_count++;
    if (ssl->s3->empty_record_count > kMaxEmptyRecords) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_TOO_MANY_EMPTY_FRAGMENTS);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
    // Apart from the limit, empty records are returned up to the caller. This
    // allows the caller to reject records of the wrong type.
  } else {
    ssl->s3->empty_record_count = 0;
  }

  if (type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Handshake messages may not interleave with any other record type.
  if (type != SSL3_RT_HANDSHAKE &&  //
      tls_has_unprocessed_handshake_data(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = type;
  return ssl_open_record_success;
}